

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

int Aig_ObjToLit(Aig_Obj_t *pObj)

{
  int iVar1;
  
  iVar1 = *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x24);
  if (-1 < iVar1) {
    return ((uint)pObj & 1) + iVar1 * 2;
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10b,"int Abc_Var2Lit(int, int)");
}

Assistant:

static inline Aig_Obj_t *  Aig_Regular( Aig_Obj_t * p )           { return (Aig_Obj_t *)((ABC_PTRUINT_T)(p) & ~01);  }